

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upnpapi.c
# Opt level: O2

int UpnpInit2(char *IfName,unsigned_short DestPort)

{
  int iVar1;
  int iVar2;
  time_t tVar3;
  long lVar4;
  int iVar5;
  char *pcVar6;
  ThreadPoolAttr local_60;
  uuid_upnp local_38;
  
  pthread_mutex_lock((pthread_mutex_t *)&gSDKInitMutex);
  iVar5 = -0x69;
  if (UpnpSdkInit == 1) goto LAB_0010d6cd;
  UpnpSdkInit = 1;
  tVar3 = time((time_t *)0x0);
  srand((uint)tVar3);
  iVar1 = UpnpInitLog();
  iVar2 = -0x75;
  if (iVar1 == 0) {
    UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x1ae,"Inside UpnpInitPreamble\n");
    iVar1 = pthread_rwlock_init((pthread_rwlock_t *)&GlobalHndRWLock,(pthread_rwlockattr_t *)0x0);
    if (((iVar1 == 0) &&
        (iVar1 = pthread_mutex_init((pthread_mutex_t *)&gUUIDMutex,(pthread_mutexattr_t *)0x0),
        iVar1 == 0)) &&
       (iVar1 = pthread_mutex_init((pthread_mutex_t *)&GlobalClientSubscribeMutex,
                                   (pthread_mutexattr_t *)0x0), iVar1 == 0)) {
      uuid_create(&local_38);
      iVar1 = 0x141190;
      upnp_uuid_unpack(&local_38,gUpnpSdkNLSuuid);
      HandleLock((char *)0x1be,iVar1);
      for (lVar4 = 0; lVar4 != 0x640; lVar4 = lVar4 + 8) {
        *(undefined8 *)((long)HandleTable + lVar4) = 0;
      }
      HandleUnlock((char *)0x1c2,iVar1);
      TPAttrInit(&local_60);
      TPAttrSetMaxThreads(&local_60,0xc);
      TPAttrSetMinThreads(&local_60,2);
      TPAttrSetStackSize(&local_60,0);
      TPAttrSetJobsPerThread(&local_60,10);
      TPAttrSetIdleTime(&local_60,5000);
      TPAttrSetMaxJobsTotal(&local_60,maxJobsTotal);
      iVar1 = ThreadPoolInit(&gSendThreadPool,&local_60);
      if (((iVar1 == 0) && (iVar1 = ThreadPoolInit(&gRecvThreadPool,&local_60), iVar1 == 0)) &&
         (iVar1 = ThreadPoolInit(&gMiniServerThreadPool,&local_60), iVar1 == 0)) {
        SetSoapCallback(soap_device_callback);
        SetGenaCallback(genaCallback);
        iVar2 = TimerThreadInit(&gTimerThread,&gSendThreadPool);
        if (iVar2 == 0) {
          pcVar6 = "NULL";
          if (IfName != (char *)0x0) {
            pcVar6 = IfName;
          }
          UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x237,
                     "UpnpInit2 with IfName=%s, DestPort=%d.\n",pcVar6,(uint)DestPort);
          iVar2 = UpnpGetIfInfo(IfName);
          if (iVar2 != 0) goto LAB_0010d6bf;
          UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",500,"Entering UpnpInitStartServers\n");
          LOCAL_PORT_V4 = DestPort;
          LOCAL_PORT_V6 = DestPort;
          LOCAL_PORT_V6_ULA_GUA = DestPort;
          iVar2 = StartMiniServer(&LOCAL_PORT_V4,&LOCAL_PORT_V6,&LOCAL_PORT_V6_ULA_GUA);
          if (iVar2 == 0) {
            membuffer_init(&gDocumentRootDir);
            membuffer_init(&gWebserverCorsString);
            iVar2 = UpnpEnableWebserver(1);
            if (iVar2 == 0) {
              iVar5 = 0;
              UpnpPrintf(UPNP_INFO,API,".upnp/src/api/upnpapi.c",0x215,
                         "Exiting UpnpInitStartServers\n");
              goto LAB_0010d6cd;
            }
          }
          else {
            UpnpPrintf(UPNP_CRITICAL,API,".upnp/src/api/upnpapi.c",0x201,
                       "Miniserver failed to start\n");
          }
        }
      }
      else {
        UpnpSdkInit = 0;
      }
      UpnpFinish();
    }
  }
LAB_0010d6bf:
  if (iVar2 != -0x69) {
    UpnpFinish();
    iVar5 = iVar2;
  }
LAB_0010d6cd:
  pthread_mutex_unlock((pthread_mutex_t *)&gSDKInitMutex);
  return iVar5;
}

Assistant:

int UpnpInit2(const char *IfName, unsigned short DestPort)
{
	int retVal;

	/* Initializes the ithread library */
	ithread_initialize_library();

	ithread_mutex_lock(&gSDKInitMutex);

	/* Check if we're already initialized. */
	if (UpnpSdkInit == 1) {
		retVal = UPNP_E_INIT;
		goto exit_function;
	}

	/* Set the UpnpSdkInit flag to 1 to indicate we're successfully
	 * initialized. */
	UpnpSdkInit = 1;

	/* Perform initialization preamble. */
	retVal = UpnpInitPreamble();
	if (retVal != UPNP_E_SUCCESS) {
		goto exit_function;
	}

	UpnpPrintf(UPNP_INFO,
		API,
		__FILE__,
		__LINE__,
		"UpnpInit2 with IfName=%s, DestPort=%d.\n",
		IfName ? IfName : "NULL",
		DestPort);

	/* Retrieve interface information (Addresses, index, etc). */
	retVal = UpnpGetIfInfo(IfName);
	if (retVal != UPNP_E_SUCCESS) {
		goto exit_function;
	}

	/* Finish initializing the SDK. */
	retVal = UpnpInitStartServers(DestPort);
	if (retVal != UPNP_E_SUCCESS) {
		goto exit_function;
	}

exit_function:
	if (retVal != UPNP_E_SUCCESS && retVal != UPNP_E_INIT) {
		UpnpFinish();
	}
	ithread_mutex_unlock(&gSDKInitMutex);

	return retVal;
}